

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

simple_token * tokenize_text(char *source,size_t start,size_t len,int format)

{
  unsigned_short type;
  int iVar1;
  simple_token *chain_start;
  simple_token *t;
  size_t len_00;
  char *pcVar2;
  char *stop;
  Scanner s;
  Scanner local_50;
  
  local_50.start = source + start;
  local_50.cur = local_50.start;
  chain_start = simple_token_new(0,start,len);
  if ((uint)format < 2) {
    stop = local_50.start + len;
    t = (simple_token *)0x0;
    pcVar2 = local_50.start;
    do {
      if (format == 0) {
        iVar1 = scan_csv(&local_50,stop);
      }
      else {
        iVar1 = scan_tsv(&local_50,stop);
      }
      len_00 = (long)local_50.start - (long)pcVar2;
      if (len_00 == 0) {
        len_00 = (long)stop - (long)pcVar2;
        if ((pcVar2 <= stop && len_00 != 0) && iVar1 == 0) goto LAB_0010963b;
      }
      else if ((iVar1 != 0) || (len_00 = (long)stop - (long)pcVar2, pcVar2 <= stop && len_00 != 0))
      {
LAB_0010963b:
        t = simple_token_new(1,(long)pcVar2 - (long)source,len_00);
        simple_token_chain_append(chain_start,t);
      }
      if (iVar1 == 0) {
        if (t == (simple_token *)0x0) {
          t = (simple_token *)0x0;
        }
        else if ((t->tail != (simple_token *)0x0) && (type = 4, t->tail->type != 4))
        goto LAB_0010965f;
      }
      else {
        type = (unsigned_short)iVar1;
LAB_0010965f:
        t = simple_token_new(type,(long)local_50.start - (long)source,
                             (long)local_50.cur - (long)local_50.start);
        simple_token_chain_append(chain_start,t);
      }
      pcVar2 = local_50.cur;
    } while (iVar1 != 0);
  }
  else {
    chain_start = (simple_token *)0x0;
    fprintf(_stderr,"ERROR.  %d is not a valid parsing format.\n",(ulong)(uint)format);
  }
  return chain_start;
}

Assistant:

simple_token * tokenize_text(const char * source, size_t start, size_t len, int format) {

	// Create re2c scanner
	Scanner s;
	s.start = &source[start];		// Start parsing
	s.cur = s.start;

	int type;						// TOKEN type
	simple_token * t = NULL;		// Create token chain
	simple_token * root = simple_token_new(0, start, len);

	// Where do we stop parsing?
	const char * stop = s.start + len;

	// Remember last token to catch other text
	const char * last_stop = s.start;


	do {
		switch (format) {
			case FORMAT_CSV:
				type = scan_csv(&s, stop);
				break;

			case FORMAT_TSV:
				type = scan_tsv(&s, stop);
				break;

			default:
				// Error
				fprintf(stderr, "ERROR.  %d is not a valid parsing format.\n", format);
				return NULL;
				break;
		}

		if (s.start != last_stop) {
			// We skipped characters between tokens

			if (type) {
				t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(s.start - last_stop));
				simple_token_chain_append(root, t);
			} else {
				if (stop > last_stop) {
					// Source text ended without final token

					t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(stop - last_stop));
					simple_token_chain_append(root, t);
				}
			}
		} else if (type == 0 && stop > last_stop) {
			// Source text ended without final token

			t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(stop - last_stop));
			simple_token_chain_append(root, t);
		}

		switch (type) {
			case 0:

				// Source finished
				if (t && t->tail && (t->tail->type != TDP_EOF)) {
					t = simple_token_new(TDP_EOF, (size_t)(s.start - source), (size_t)(s.cur - s.start));
					simple_token_chain_append(root, t);
				}

				break;

			default:
				t = simple_token_new(type, (size_t)(s.start - source), (size_t)(s.cur - s.start));
				simple_token_chain_append(root, t);
				break;
		}

		// Remember where token ends to detect skipped characters
		last_stop = s.cur;
	} while (type != 0);

	return root;
}